

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

HalfedgeMesh * __thiscall CMU462::HalfedgeMesh::operator=(HalfedgeMesh *this,HalfedgeMesh *mesh)

{
  bool bVar1;
  reference __x;
  reference __x_00;
  reference __x_01;
  reference pFVar2;
  pointer pHVar3;
  VertexIter *pVVar4;
  mapped_type *pmVar5;
  EdgeIter *pEVar6;
  mapped_type *pmVar7;
  FaceIter *pFVar8;
  mapped_type *pmVar9;
  pointer pVVar10;
  pointer pEVar11;
  pointer pFVar12;
  HalfedgeIter *pHVar13;
  mapped_type *pmVar14;
  _List_const_iterator<CMU462::Halfedge> local_290;
  _Self local_288;
  _Self local_280;
  FaceIter b_1;
  _List_const_iterator<CMU462::Halfedge> local_270;
  _Self local_268;
  _Self local_260;
  FaceIter f_1;
  _List_const_iterator<CMU462::Halfedge> local_250;
  _Self local_248;
  _Self local_240;
  EdgeIter e_1;
  _List_const_iterator<CMU462::Halfedge> local_230;
  _Self local_228;
  _Self local_220;
  VertexIter v_1;
  _List_const_iterator<CMU462::Face> local_210;
  _List_const_iterator<CMU462::Edge> local_208;
  _List_const_iterator<CMU462::Vertex> local_200;
  _List_const_iterator<CMU462::Halfedge> local_1f8;
  _List_const_iterator<CMU462::Halfedge> local_1f0;
  _Self local_1e8;
  _Self local_1e0;
  HalfedgeIter he;
  iterator local_1d0;
  const_iterator local_1c8;
  _List_node_base *local_1c0;
  _Self local_1b8;
  _Self local_1b0;
  FaceCIter b;
  iterator local_1a0;
  const_iterator local_198;
  _List_node_base *local_190;
  _Self local_188;
  _Self local_180;
  FaceCIter f;
  iterator local_170;
  const_iterator local_168;
  _List_node_base *local_160;
  _Self local_158;
  _Self local_150;
  EdgeCIter e;
  iterator local_140;
  const_iterator local_138;
  _List_node_base *local_130;
  _Self local_128;
  _Self local_120;
  VertexCIter v;
  iterator local_110;
  const_iterator local_108;
  _List_node_base *local_100;
  _Self local_f8 [3];
  _Self local_e0;
  HalfedgeCIter h;
  map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
  faceOldToNew;
  map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
  edgeOldToNew;
  map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
  vertexOldToNew;
  map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  halfedgeOldToNew;
  HalfedgeMesh *mesh_local;
  HalfedgeMesh *this_local;
  
  std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::clear(&this->halfedges);
  std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::clear(&this->vertices);
  std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::clear(&this->edges);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear(&this->faces);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear(&this->boundaries);
  std::
  map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  ::map((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
         *)&vertexOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
  ::map((map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
         *)&edgeOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
  ::map((map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
         *)&faceOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
  ::map((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
         *)&h);
  local_e0._M_node = (_List_node_base *)halfedgesBegin(mesh);
  while( true ) {
    local_f8[0]._M_node = (_List_node_base *)halfedgesEnd(mesh);
    bVar1 = std::operator!=(&local_e0,local_f8);
    if (!bVar1) break;
    local_110._M_node =
         (_List_node_base *)
         std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::end
                   (&this->halfedges);
    std::_List_const_iterator<CMU462::Halfedge>::_List_const_iterator(&local_108,&local_110);
    __x = std::_List_const_iterator<CMU462::Halfedge>::operator*(&local_e0);
    local_100 = (_List_node_base *)
                std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::insert
                          (&this->halfedges,local_108,__x);
    pmVar14 = std::
              map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                            *)&vertexOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &local_e0);
    pmVar14->_M_node = local_100;
    v._M_node = (_List_node_base *)
                std::_List_const_iterator<CMU462::Halfedge>::operator++(&local_e0,0);
  }
  local_120._M_node = (_List_node_base *)verticesBegin(mesh);
  while( true ) {
    local_128._M_node = (_List_node_base *)verticesEnd(mesh);
    bVar1 = std::operator!=(&local_120,&local_128);
    if (!bVar1) break;
    local_140._M_node =
         (_List_node_base *)
         std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::end(&this->vertices);
    std::_List_const_iterator<CMU462::Vertex>::_List_const_iterator(&local_138,&local_140);
    __x_00 = std::_List_const_iterator<CMU462::Vertex>::operator*(&local_120);
    local_130 = (_List_node_base *)
                std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::insert
                          (&this->vertices,local_138,__x_00);
    pmVar5 = std::
             map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
                           *)&edgeOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_120);
    pmVar5->_M_node = local_130;
    e._M_node = (_List_node_base *)
                std::_List_const_iterator<CMU462::Vertex>::operator++(&local_120,0);
  }
  local_150._M_node = (_List_node_base *)edgesBegin(mesh);
  while( true ) {
    local_158._M_node = (_List_node_base *)edgesEnd(mesh);
    bVar1 = std::operator!=(&local_150,&local_158);
    if (!bVar1) break;
    local_170._M_node =
         (_List_node_base *)
         std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::end(&this->edges);
    std::_List_const_iterator<CMU462::Edge>::_List_const_iterator(&local_168,&local_170);
    __x_01 = std::_List_const_iterator<CMU462::Edge>::operator*(&local_150);
    local_160 = (_List_node_base *)
                std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::insert
                          (&this->edges,local_168,__x_01);
    pmVar7 = std::
             map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
                           *)&faceOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_150);
    pmVar7->_M_node = local_160;
    f._M_node = (_List_node_base *)std::_List_const_iterator<CMU462::Edge>::operator++(&local_150,0)
    ;
  }
  local_180._M_node = (_List_node_base *)facesBegin(mesh);
  while( true ) {
    local_188._M_node = (_List_node_base *)facesEnd(mesh);
    bVar1 = std::operator!=(&local_180,&local_188);
    if (!bVar1) break;
    local_1a0._M_node =
         (_List_node_base *)
         std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::end(&this->faces);
    std::_List_const_iterator<CMU462::Face>::_List_const_iterator(&local_198,&local_1a0);
    pFVar2 = std::_List_const_iterator<CMU462::Face>::operator*(&local_180);
    local_190 = (_List_node_base *)
                std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::insert
                          (&this->faces,local_198,pFVar2);
    pmVar9 = std::
             map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
                           *)&h,&local_180);
    pmVar9->_M_node = local_190;
    b._M_node = (_List_node_base *)std::_List_const_iterator<CMU462::Face>::operator++(&local_180,0)
    ;
  }
  local_1b0._M_node = (_List_node_base *)boundariesBegin(mesh);
  while( true ) {
    local_1b8._M_node = (_List_node_base *)boundariesEnd(mesh);
    bVar1 = std::operator!=(&local_1b0,&local_1b8);
    if (!bVar1) break;
    local_1d0._M_node =
         (_List_node_base *)
         std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::end(&this->boundaries);
    std::_List_const_iterator<CMU462::Face>::_List_const_iterator(&local_1c8,&local_1d0);
    pFVar2 = std::_List_const_iterator<CMU462::Face>::operator*(&local_1b0);
    local_1c0 = (_List_node_base *)
                std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::insert
                          (&this->boundaries,local_1c8,pFVar2);
    pmVar9 = std::
             map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
                           *)&h,&local_1b0);
    pmVar9->_M_node = local_1c0;
    he._M_node = (_List_node_base *)
                 std::_List_const_iterator<CMU462::Face>::operator++(&local_1b0,0);
  }
  local_1e0._M_node = (_List_node_base *)halfedgesBegin(this);
  while( true ) {
    local_1e8._M_node = (_List_node_base *)halfedgesEnd(this);
    bVar1 = std::operator!=(&local_1e0,&local_1e8);
    if (!bVar1) break;
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_1e0);
    pHVar13 = Halfedge::next(pHVar3);
    std::_List_const_iterator<CMU462::Halfedge>::_List_const_iterator(&local_1f0,pHVar13);
    pmVar14 = std::
              map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                            *)&vertexOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &local_1f0);
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_1e0);
    pHVar13 = Halfedge::next(pHVar3);
    pHVar13->_M_node = pmVar14->_M_node;
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_1e0);
    pHVar13 = Halfedge::twin(pHVar3);
    std::_List_const_iterator<CMU462::Halfedge>::_List_const_iterator(&local_1f8,pHVar13);
    pmVar14 = std::
              map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                            *)&vertexOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &local_1f8);
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_1e0);
    pHVar13 = Halfedge::twin(pHVar3);
    pHVar13->_M_node = pmVar14->_M_node;
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_1e0);
    pVVar4 = Halfedge::vertex(pHVar3);
    std::_List_const_iterator<CMU462::Vertex>::_List_const_iterator(&local_200,pVVar4);
    pmVar5 = std::
             map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
                           *)&edgeOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_200);
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_1e0);
    pVVar4 = Halfedge::vertex(pHVar3);
    pVVar4->_M_node = pmVar5->_M_node;
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_1e0);
    pEVar6 = Halfedge::edge(pHVar3);
    std::_List_const_iterator<CMU462::Edge>::_List_const_iterator(&local_208,pEVar6);
    pmVar7 = std::
             map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
                           *)&faceOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_208);
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_1e0);
    pEVar6 = Halfedge::edge(pHVar3);
    pEVar6->_M_node = pmVar7->_M_node;
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_1e0);
    pFVar8 = Halfedge::face(pHVar3);
    std::_List_const_iterator<CMU462::Face>::_List_const_iterator(&local_210,pFVar8);
    pmVar9 = std::
             map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
                           *)&h,&local_210);
    pHVar3 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_1e0);
    pFVar8 = Halfedge::face(pHVar3);
    pFVar8->_M_node = pmVar9->_M_node;
    v_1._M_node = (_List_node_base *)std::_List_iterator<CMU462::Halfedge>::operator++(&local_1e0,0)
    ;
  }
  local_220._M_node = (_List_node_base *)verticesBegin(this);
  while( true ) {
    local_228._M_node = (_List_node_base *)verticesEnd(this);
    bVar1 = std::operator!=(&local_220,&local_228);
    if (!bVar1) break;
    pVVar10 = std::_List_iterator<CMU462::Vertex>::operator->(&local_220);
    pHVar13 = Vertex::halfedge(pVVar10);
    std::_List_const_iterator<CMU462::Halfedge>::_List_const_iterator(&local_230,pHVar13);
    pmVar14 = std::
              map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                            *)&vertexOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &local_230);
    pVVar10 = std::_List_iterator<CMU462::Vertex>::operator->(&local_220);
    pHVar13 = Vertex::halfedge(pVVar10);
    pHVar13->_M_node = pmVar14->_M_node;
    e_1._M_node = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(&local_220,0);
  }
  local_240._M_node = (_List_node_base *)edgesBegin(this);
  while( true ) {
    local_248._M_node = (_List_node_base *)edgesEnd(this);
    bVar1 = std::operator!=(&local_240,&local_248);
    if (!bVar1) break;
    pEVar11 = std::_List_iterator<CMU462::Edge>::operator->(&local_240);
    pHVar13 = Edge::halfedge(pEVar11);
    std::_List_const_iterator<CMU462::Halfedge>::_List_const_iterator(&local_250,pHVar13);
    pmVar14 = std::
              map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                            *)&vertexOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &local_250);
    pEVar11 = std::_List_iterator<CMU462::Edge>::operator->(&local_240);
    pHVar13 = Edge::halfedge(pEVar11);
    pHVar13->_M_node = pmVar14->_M_node;
    f_1._M_node = (_List_node_base *)std::_List_iterator<CMU462::Edge>::operator++(&local_240,0);
  }
  local_260._M_node = (_List_node_base *)facesBegin(this);
  while( true ) {
    local_268._M_node = (_List_node_base *)facesEnd(this);
    bVar1 = std::operator!=(&local_260,&local_268);
    if (!bVar1) break;
    pFVar12 = std::_List_iterator<CMU462::Face>::operator->(&local_260);
    pHVar13 = Face::halfedge(pFVar12);
    std::_List_const_iterator<CMU462::Halfedge>::_List_const_iterator(&local_270,pHVar13);
    pmVar14 = std::
              map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                            *)&vertexOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &local_270);
    pFVar12 = std::_List_iterator<CMU462::Face>::operator->(&local_260);
    pHVar13 = Face::halfedge(pFVar12);
    pHVar13->_M_node = pmVar14->_M_node;
    b_1._M_node = (_List_node_base *)std::_List_iterator<CMU462::Face>::operator++(&local_260,0);
  }
  local_280._M_node = (_List_node_base *)boundariesBegin(this);
  while( true ) {
    local_288._M_node = (_List_node_base *)boundariesEnd(this);
    bVar1 = std::operator!=(&local_280,&local_288);
    if (!bVar1) break;
    pFVar12 = std::_List_iterator<CMU462::Face>::operator->(&local_280);
    pHVar13 = Face::halfedge(pFVar12);
    std::_List_const_iterator<CMU462::Halfedge>::_List_const_iterator(&local_290,pHVar13);
    pmVar14 = std::
              map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator[]((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                            *)&vertexOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           &local_290);
    pFVar12 = std::_List_iterator<CMU462::Face>::operator->(&local_280);
    pHVar13 = Face::halfedge(pFVar12);
    pHVar13->_M_node = pmVar14->_M_node;
    std::_List_iterator<CMU462::Face>::operator++(&local_280,0);
  }
  std::
  map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
  ::~map((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
          *)&h);
  std::
  map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
  ::~map((map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
          *)&faceOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
  ::~map((map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
          *)&edgeOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  ::~map((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
          *)&vertexOldToNew._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return this;
}

Assistant:

const HalfedgeMesh& HalfedgeMesh::operator=(const HalfedgeMesh& mesh)
    // The assignment operator does a "deep" copy of the halfedge mesh data
    // structure; in other words, it makes new instances of each mesh element, and
    // ensures that pointers in the copy point to the newly allocated elements
    // rather than elements in the original mesh.  This behavior is especially
    // important for making assignments, since the mesh on the right-hand side of an
    // assignment may be temporary (hence any pointers to elements in this mesh will
    // become invalid as soon as it is released.)
  {
    // Clear any existing elements.
    halfedges.clear();
    vertices.clear();
    edges.clear();
    faces.clear();
    boundaries.clear();

    // These maps will be used to identify elements of the old mesh
    // with elements of the new mesh.  (Note that we can use a single
    // map for both interior and boundary faces, because the map
    // doesn't care which list of faces these iterators come from.)
    map<HalfedgeCIter, HalfedgeIter> halfedgeOldToNew;
    map<VertexCIter, VertexIter> vertexOldToNew;
    map<EdgeCIter, EdgeIter> edgeOldToNew;
    map<FaceCIter, FaceIter> faceOldToNew;

    // Copy geometry from the original mesh and create a map from
    // pointers in the original mesh to those in the new mesh.
    for (HalfedgeCIter h = mesh.halfedgesBegin(); h != mesh.halfedgesEnd(); h++)
      halfedgeOldToNew[h] = halfedges.insert(halfedges.end(), *h);
    for (VertexCIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++)
      vertexOldToNew[v] = vertices.insert(vertices.end(), *v);
    for (EdgeCIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++)
      edgeOldToNew[e] = edges.insert(edges.end(), *e);
    for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++)
      faceOldToNew[f] = faces.insert(faces.end(), *f);
    for (FaceCIter b = mesh.boundariesBegin(); b != mesh.boundariesEnd(); b++)
      faceOldToNew[b] = boundaries.insert(boundaries.end(), *b);

    // "Search and replace" old pointers with new ones.
    for (HalfedgeIter he = halfedgesBegin(); he != halfedgesEnd(); he++) {
      he->next() = halfedgeOldToNew[he->next()];
      he->twin() = halfedgeOldToNew[he->twin()];
      he->vertex() = vertexOldToNew[he->vertex()];
      he->edge() = edgeOldToNew[he->edge()];
      he->face() = faceOldToNew[he->face()];
    }
    for (VertexIter v = verticesBegin(); v != verticesEnd(); v++)
      v->halfedge() = halfedgeOldToNew[v->halfedge()];
    for (EdgeIter e = edgesBegin(); e != edgesEnd(); e++)
      e->halfedge() = halfedgeOldToNew[e->halfedge()];
    for (FaceIter f = facesBegin(); f != facesEnd(); f++)
      f->halfedge() = halfedgeOldToNew[f->halfedge()];
    for (FaceIter b = boundariesBegin(); b != boundariesEnd(); b++)
      b->halfedge() = halfedgeOldToNew[b->halfedge()];

    // Return a reference to the new mesh.
    return *this;
  }